

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char> __thiscall
fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,basic_string_view<char> s,
          basic_format_specs<char> *specs)

{
  type tVar1;
  size_t width;
  buffer_appender<char> bVar2;
  basic_format_specs<char> *specs_00;
  char *size_00;
  size_t size;
  basic_string_view<char> s_00;
  anon_class_16_2_3f014a30 local_30;
  
  specs_00 = (basic_format_specs<char> *)s.size_;
  size_00 = s.data_;
  if (-1 < specs_00->precision) {
    tVar1 = to_unsigned<int>(specs_00->precision);
    if ((char *)(ulong)tVar1 < size_00) {
      tVar1 = to_unsigned<int>(specs_00->precision);
      if ((char *)(ulong)tVar1 <= size_00) {
        size_00 = (char *)(ulong)tVar1;
      }
    }
  }
  if (specs_00->width == 0) {
    width = 0;
  }
  else {
    s_00.size_ = (size_t)size_00;
    s_00.data_ = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    width = count_code_points(s_00);
  }
  local_30.data = (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_30.size = (size_t)size_00;
  bVar2 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)this,specs_00,(size_t)size_00,width,&local_30);
  return (buffer_appender<char>)
         bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}